

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFCopyDescriptor.cpp
# Opt level: O0

void amrex::InterpFillFab
               (MultiFabCopyDescriptor *fabCopyDesc,
               Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *fillBoxIds,
               MultiFabId faid1,MultiFabId faid2,FArrayBox *dest,Real t1,Real t2,Real t,int src_comp
               ,int dest_comp,int num_comp,bool extrap)

{
  FabArrayCopyDescriptor<amrex::FArrayBox> *in_RDI;
  BaseFab<double> *in_R8;
  longdouble x;
  double in_XMM0_Qa;
  Real RVar1;
  double dVar2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  undefined1 in_stack_00000018;
  FArrayBox dest2;
  FArrayBox dest1;
  Real teps;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined2 uVar5;
  undefined1 in_stack_fffffffffffffe72;
  undefined1 in_stack_fffffffffffffe73;
  int in_stack_fffffffffffffe74;
  Box *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  double *in_stack_fffffffffffffe88;
  BaseFab<double> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 uVar7;
  FillBoxId *in_stack_fffffffffffffed0;
  FillBoxId *fillboxid;
  FabArrayCopyDescriptor<amrex::FArrayBox> *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  FabArrayId faid;
  Box *in_stack_ffffffffffffff08;
  Real in_stack_ffffffffffffff10;
  Real in_stack_ffffffffffffff18;
  Real in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  BaseFab<double> *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  BaseFab<double> *in_stack_ffffffffffffff40;
  BaseFab<double> *in_stack_ffffffffffffff48;
  int comp;
  undefined3 in_stack_ffffffffffffffb8;
  uint numcomp;
  
  faid.fabArrayId = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  numcomp = CONCAT13(in_stack_00000018,in_stack_ffffffffffffffb8) & 0x1ffffff;
  x = (longdouble)1000.0;
  uVar3 = SUB104(x,0);
  uVar4 = (undefined4)((unkuint10)x >> 0x20);
  uVar5 = (undefined2)((unkuint10)x >> 0x40);
  RVar1 = literals::operator____rt((literals *)in_RDI,x);
  dVar2 = (in_XMM1_Qa - in_XMM0_Qa) / RVar1;
  if ((in_XMM2_Qa < in_XMM0_Qa - dVar2) || (in_XMM0_Qa + dVar2 < in_XMM2_Qa)) {
    if ((in_XMM2_Qa <= in_XMM1_Qa - dVar2) || (in_XMM1_Qa + dVar2 <= in_XMM2_Qa)) {
      BaseFab<double>::box(in_R8);
      comp = SUB84(dVar2,0);
      BaseFab<double>::nComp(in_R8);
      uVar7 = 0;
      fillboxid = (FillBoxId *)0x0;
      uVar6 = 1;
      FArrayBox::FArrayBox
                ((FArrayBox *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,(bool)in_stack_fffffffffffffe73
                 ,(bool)in_stack_fffffffffffffe72,(Arena *)CONCAT44(uVar4,uVar3));
      std::numeric_limits<double>::quiet_NaN();
      BaseFab<double>::setVal<(amrex::RunOn)1>(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      BaseFab<double>::box(in_R8);
      BaseFab<double>::nComp(in_R8);
      FArrayBox::FArrayBox
                ((FArrayBox *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,(bool)in_stack_fffffffffffffe73
                 ,(bool)in_stack_fffffffffffffe72,(Arena *)CONCAT44(uVar4,uVar3));
      std::numeric_limits<double>::quiet_NaN();
      BaseFab<double>::setVal<(amrex::RunOn)1>(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::operator[]
                ((Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,
                          CONCAT13(in_stack_fffffffffffffe73,
                                   CONCAT12(in_stack_fffffffffffffe72,uVar5))),CONCAT44(uVar4,uVar3)
                );
      FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
                (in_stack_fffffffffffffed8,faid,fillboxid,(FArrayBox *)CONCAT44(uVar7,uVar6));
      Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::operator[]
                ((Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,
                          CONCAT13(in_stack_fffffffffffffe73,
                                   CONCAT12(in_stack_fffffffffffffe72,uVar5))),CONCAT44(uVar4,uVar3)
                );
      FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
                (in_stack_fffffffffffffed8,faid,fillboxid,(FArrayBox *)CONCAT44(uVar7,uVar6));
      BaseFab<double>::box(in_R8);
      BaseFab<double>::linInterp<(amrex::RunOn)1>
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,comp,
                 numcomp);
      FArrayBox::~FArrayBox((FArrayBox *)0xff3cc7);
      FArrayBox::~FArrayBox((FArrayBox *)0xff3cd4);
    }
    else {
      Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::operator[]
                ((Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,
                          CONCAT13(in_stack_fffffffffffffe73,
                                   CONCAT12(in_stack_fffffffffffffe72,uVar5))),CONCAT44(uVar4,uVar3)
                );
      FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
                (in_RDI,faid,in_stack_fffffffffffffed0,
                 (FArrayBox *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    }
  }
  else {
    Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::operator[]
              ((Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
               CONCAT44(in_stack_fffffffffffffe74,
                        CONCAT13(in_stack_fffffffffffffe73,CONCAT12(in_stack_fffffffffffffe72,uVar5)
                                )),CONCAT44(uVar4,uVar3));
    FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
              (in_stack_fffffffffffffed8,(FabArrayId)(int)((ulong)in_RDI >> 0x20),
               in_stack_fffffffffffffed0,
               (FArrayBox *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  }
  return;
}

Assistant:

void
InterpFillFab (MultiFabCopyDescriptor& fabCopyDesc,
               const Vector<FillBoxId>& fillBoxIds,
               MultiFabId              faid1,
               MultiFabId              faid2,
               FArrayBox&              dest,
               Real                    t1,
               Real                    t2,
               Real                    t,
               int                     src_comp,   // these comps need to be removed
               int                     dest_comp,  // from this routine
               int                     num_comp,
               bool                    extrap)
{
    amrex::ignore_unused(extrap);

    const Real teps = (t2-t1)/1000.0_rt;

    BL_ASSERT(extrap || ( (t>=t1-teps) && (t <= t2+teps) ) );

    if (t >= t1-teps && t <= t1+teps)
    {
        fabCopyDesc.FillFab(faid1, fillBoxIds[0], dest);
    }
    else if (t > t2-teps && t < t2+teps)
    {
        fabCopyDesc.FillFab(faid2, fillBoxIds[0], dest);
    }
    else
    {
        BL_ASSERT(dest_comp + num_comp <= dest.nComp());

        FArrayBox dest1(dest.box(), dest.nComp());
        dest1.setVal<RunOn::Host>(std::numeric_limits<Real>::quiet_NaN());
        FArrayBox dest2(dest.box(), dest.nComp());
        dest2.setVal<RunOn::Host>(std::numeric_limits<Real>::quiet_NaN());
        fabCopyDesc.FillFab(faid1, fillBoxIds[0], dest1);
        fabCopyDesc.FillFab(faid2, fillBoxIds[1], dest2);
        dest.linInterp<RunOn::Host>
                      (dest1,
                       src_comp,
                       dest2,
                       src_comp,
                       t1,
                       t2,
                       t,
                       dest.box(),
                       dest_comp,
                       num_comp);
    }
}